

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsvg.c
# Opt level: O0

FT_Error ft_svg_transform(FT_Renderer_conflict renderer,FT_GlyphSlot slot,FT_Matrix *_matrix,
                         FT_Vector *_delta)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  FT_Int32 FVar4;
  FT_Int32 FVar5;
  FT_Int32 FVar6;
  FT_Int32 FVar7;
  FT_Pos y;
  FT_Pos x;
  FT_Matrix b;
  FT_Matrix a;
  FT_Vector tmp_delta;
  FT_Matrix tmp_matrix;
  FT_Vector *delta;
  FT_Matrix *matrix;
  FT_SVG_Document doc;
  FT_Vector *_delta_local;
  FT_Matrix *_matrix_local;
  FT_GlyphSlot slot_local;
  FT_Renderer_conflict renderer_local;
  
  pvVar1 = slot->other;
  delta = (FT_Vector *)_matrix;
  if (_matrix == (FT_Matrix *)0x0) {
    tmp_delta.y = 0x10000;
    delta = (FT_Vector *)&tmp_delta.y;
  }
  tmp_matrix.yy = (FT_Fixed)_delta;
  if (_delta == (FT_Vector *)0x0) {
    a.yy = 0;
    tmp_delta.x = 0;
    tmp_matrix.yy = (FT_Fixed)&a.yy;
  }
  b.yy = *(FT_Fixed *)((long)pvVar1 + 0x50);
  a.xx = *(FT_Fixed *)((long)pvVar1 + 0x58);
  a.xy = *(FT_Fixed *)((long)pvVar1 + 0x60);
  a.yx = *(FT_Fixed *)((long)pvVar1 + 0x68);
  x = delta->x;
  b.xx = delta->y;
  b.xy = delta[1].x;
  b.yx = delta[1].y;
  FT_Matrix_Multiply((FT_Matrix *)&x,(FT_Matrix *)&b.yy);
  FVar4 = FT_MulFix_x86_64((FT_Int32)delta->x,(FT_Int32)*(undefined8 *)((long)pvVar1 + 0x70));
  FVar5 = FT_MulFix_x86_64((FT_Int32)delta->y,(FT_Int32)*(undefined8 *)((long)pvVar1 + 0x78));
  lVar2 = *(long *)tmp_matrix.yy;
  FVar6 = FT_MulFix_x86_64((FT_Int32)delta[1].x,(FT_Int32)*(undefined8 *)((long)pvVar1 + 0x70));
  FVar7 = FT_MulFix_x86_64((FT_Int32)delta[1].y,(FT_Int32)*(undefined8 *)((long)pvVar1 + 0x78));
  lVar3 = *(long *)(tmp_matrix.yy + 8);
  *(long *)((long)pvVar1 + 0x70) = (long)FVar4 + (long)FVar5 + lVar2;
  *(long *)((long)pvVar1 + 0x78) = (long)FVar6 + (long)FVar7 + lVar3;
  *(FT_Fixed *)((long)pvVar1 + 0x50) = b.yy;
  *(FT_Fixed *)((long)pvVar1 + 0x58) = a.xx;
  *(FT_Fixed *)((long)pvVar1 + 0x60) = a.xy;
  *(FT_Fixed *)((long)pvVar1 + 0x68) = a.yx;
  return 0;
}

Assistant:

static FT_Error
  ft_svg_transform( FT_Renderer       renderer,
                    FT_GlyphSlot      slot,
                    const FT_Matrix*  _matrix,
                    const FT_Vector*  _delta )
  {
    FT_SVG_Document  doc    = (FT_SVG_Document)slot->other;
    FT_Matrix*       matrix = (FT_Matrix*)_matrix;
    FT_Vector*       delta  = (FT_Vector*)_delta;

    FT_Matrix  tmp_matrix;
    FT_Vector  tmp_delta;

    FT_Matrix  a, b;
    FT_Pos     x, y;


    FT_UNUSED( renderer );

    if ( !matrix )
    {
      tmp_matrix.xx = 0x10000;
      tmp_matrix.xy = 0;
      tmp_matrix.yx = 0;
      tmp_matrix.yy = 0x10000;

      matrix = &tmp_matrix;
    }

    if ( !delta )
    {
      tmp_delta.x = 0;
      tmp_delta.y = 0;

      delta = &tmp_delta;
    }

    a = doc->transform;
    b = *matrix;
    FT_Matrix_Multiply( &b, &a );


    x = ADD_LONG( ADD_LONG( FT_MulFix( matrix->xx, doc->delta.x ),
                            FT_MulFix( matrix->xy, doc->delta.y ) ),
                  delta->x );
    y = ADD_LONG( ADD_LONG( FT_MulFix( matrix->yx, doc->delta.x ),
                            FT_MulFix( matrix->yy, doc->delta.y ) ),
                  delta->y );

    doc->delta.x   = x;
    doc->delta.y   = y;
    doc->transform = a;

    return FT_Err_Ok;
  }